

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd.hpp
# Opt level: O2

double duckdb::alp::AlpRDCompression<float,_true>::FindBestDictionary
                 (vector<unsigned_int,_true> *values,State *state)

{
  uint uVar1;
  long lVar2;
  uint uVar3;
  double dVar4;
  double dVar5;
  
  dVar5 = 2147483647.0;
  uVar3 = 0;
  lVar2 = 0x10;
  while( true ) {
    uVar1 = uVar3 & 0xff;
    if (lVar2 == 0) break;
    uVar3 = (int)lVar2 + 0xf;
    dVar4 = BuildLeftPartsDictionary<false>(values,(uint8_t)uVar3,state);
    if (dVar5 < dVar4) {
      uVar3 = uVar1;
    }
    dVar5 = (double)(-(ulong)(dVar5 < dVar4) & (ulong)dVar5 |
                    ~-(ulong)(dVar5 < dVar4) & (ulong)dVar4);
    lVar2 = lVar2 + -1;
  }
  dVar5 = BuildLeftPartsDictionary<true>(values,(uint8_t)uVar3,state);
  return dVar5;
}

Assistant:

static double FindBestDictionary(const vector<EXACT_TYPE> &values, State &state) {
		uint8_t right_bit_width = 0;
		double best_dict_size = NumericLimits<int32_t>::Maximum();
		//! Finding the best position to CUT the values
		for (idx_t i = 1; i <= AlpRDConstants::CUTTING_LIMIT; i++) {
			uint8_t candidate_right_bit_width = UnsafeNumericCast<uint8_t>(EXACT_TYPE_BITSIZE - i);
			double estimated_size = BuildLeftPartsDictionary<false>(values, candidate_right_bit_width, state);
			if (estimated_size <= best_dict_size) {
				right_bit_width = candidate_right_bit_width;
				best_dict_size = estimated_size;
			}
			// TODO: We could implement an early exit mechanism similar to normal ALP
		}
		double estimated_size = BuildLeftPartsDictionary<true>(values, right_bit_width, state);
		return estimated_size;
	}